

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O2

ModGroup * __thiscall
RenX_ModSystemPlugin::getGroupByName
          (RenX_ModSystemPlugin *this,string_view name,ModGroup *defaultGroup)

{
  bool bVar1;
  ModGroup *pMVar2;
  _List_node_base *p_Var3;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  
  rhs._M_len = name._M_str;
  pMVar2 = defaultGroup;
  p_Var3 = (_List_node_base *)&this->groups;
  do {
    p_Var3 = (((_List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->groups) {
      return defaultGroup;
    }
    rhs._M_str = &pMVar2->lockSteam;
    bVar1 = jessilib::equalsi<char,char>
                      ((jessilib *)(p_Var3 + 6),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       name._M_len,rhs);
  } while (!bVar1);
  return (ModGroup *)(p_Var3 + 1);
}

Assistant:

RenX_ModSystemPlugin::ModGroup *RenX_ModSystemPlugin::getGroupByName(std::string_view name, ModGroup *defaultGroup) const {
	for (const auto& group : groups) {
		if (jessilib::equalsi(group.name, name)) {
			return const_cast<ModGroup*>(&group);
		}
	}

	return defaultGroup;
}